

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarManObjIsConst(void *pMan,Aig_Obj_t *pObj)

{
  int Id;
  word *pwVar1;
  word wVar2;
  int local_3c;
  int w;
  word Flip;
  word *pSim;
  Ssw_RarMan_t *p;
  Aig_Obj_t *pObj_local;
  void *pMan_local;
  
  Id = Aig_ObjId(pObj);
  pwVar1 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,Id);
  wVar2 = 0;
  if ((*(ulong *)&pObj->field_0x18 >> 3 & 1) != 0) {
    wVar2 = 0xffffffffffffffff;
  }
  local_3c = 0;
  while( true ) {
    if (*(int *)(*pMan + 4) <= local_3c) {
      return 1;
    }
    if (pwVar1[local_3c] != wVar2) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Ssw_RarManObjIsConst( void * pMan, Aig_Obj_t * pObj )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    word * pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    word Flip = pObj->fPhase ? ~(word)0 : 0;
    int w;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim[w] ^ Flip )
            return 0;
    return 1;
}